

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

int __thiscall
UnifiedRegex::TryMatchSetInst::Print(TryMatchSetInst *this,DebugWriter *w,Label label,Char *litbuf)

{
  undefined4 in_register_00000014;
  ulong uVar1;
  Inst *inst;
  DebugWriter *this_00;
  
  DebugWriter::Print(w,L"L%04x: ",CONCAT44(in_register_00000014,label));
  if (DAT_015bc47d == '\x01') {
    DebugWriter::Print(w,L"(0x%03x bytes) ",0x2d);
  }
  DebugWriter::Print(w,L"TryMatchSet");
  DebugWriter::Print(w,L"(");
  DebugWriter::Print(w,L"set: ");
  RuntimeCharSet<char16_t>::Print(&(this->super_SetMixin<false>).set,w);
  DebugWriter::Print(w,L", ");
  uVar1 = 0xffff;
  if (DAT_01593300 == '\0') {
    uVar1 = (ulong)(this->super_TryMixin).failLabel;
  }
  DebugWriter::Print(w,L"failLabel: L%04x",uVar1);
  DebugWriter::PrintEOL(w,L")");
  if (DAT_015bc47d == '\x01') {
    this_00 = w;
    DebugWriter::Indent(w);
    Inst::PrintBytes<UnifiedRegex::Inst>((Inst *)this_00,w,inst,&this->super_Inst,L"Inst");
    Inst::PrintBytes<UnifiedRegex::SetMixin<false>>
              (&this->super_Inst,w,&this->super_Inst,&this->super_SetMixin<false>,L"SetMixin<false>"
              );
    Inst::PrintBytes<UnifiedRegex::TryMixin>
              (&this->super_Inst,w,&this->super_Inst,&this->super_TryMixin,L"TryMixin");
    DebugWriter::Unindent(w);
  }
  return 0x2d;
}

Assistant:

int TryMatchSetInst::Print(DebugWriter* w, Label label, const Char* litbuf) const
    {
        PRINT_RE_BYTECODE_BEGIN("TryMatchSet");
        PRINT_MIXIN_COMMA(SetMixin<false>);
        PRINT_MIXIN(TryMixin);
        PRINT_RE_BYTECODE_MID();
        PRINT_BYTES(SetMixin<false>);
        PRINT_BYTES(TryMixin);
        PRINT_RE_BYTECODE_END();
    }